

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_link(DisasContext_conflict2 *s,uint16_t insn,int32_t offset)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 val;
  TCGv_i32 ret;
  TCGv_i32 *ppTVar1;
  TCGv_i32 *ppTVar2;
  uint uVar3;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar3 = insn & 7;
  ppTVar2 = s->writeback;
  ppTVar1 = tcg_ctx->cpu_aregs;
  if (((uint)s->writeback_mask >> uVar3 & 1) != 0) {
    ppTVar1 = ppTVar2;
  }
  val = ppTVar1[uVar3];
  ret = tcg_temp_new_i32(tcg_ctx);
  ppTVar1 = ppTVar2;
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
  }
  tcg_gen_subi_i32_m68k(tcg_ctx,ret,ppTVar1[7],4);
  gen_store(s,2,ret,val,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if ((short)uVar3 != 7) {
    tcg_gen_mov_i32(tcg_ctx,val,ret);
  }
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar2[7],ret,offset);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_link(DisasContext *s, uint16_t insn, int32_t offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;

    reg = AREG(insn, 0);
    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_subi_i32(tcg_ctx, tmp, QREG_SP, 4);
    gen_store(s, OS_LONG, tmp, reg, IS_USER(s));
    if ((insn & 7) != 7) {
        tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    }
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, tmp, offset);
    tcg_temp_free(tcg_ctx, tmp);
}